

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939cat.c
# Opt level: O1

void j1939cat_print_timestamp(j1939cat_priv *priv,char *name,timespec *cur)

{
  if (cur->tv_nsec == 0 && cur->tv_sec == 0) {
    return;
  }
  j1939cat_print_timestamp_cold_1();
  return;
}

Assistant:

static void j1939cat_print_timestamp(struct j1939cat_priv *priv, const char *name,
			      struct timespec *cur)
{
	struct j1939cat_stats *stats = &priv->stats;

	if (!(cur->tv_sec | cur->tv_nsec))
		return;

	fprintf(stderr, "  %s: %llu s %llu us (seq=%03u, send=%07u)",
			name, (unsigned long long)cur->tv_sec, (unsigned long long)cur->tv_nsec / 1000,
			stats->tskey, stats->send);

	fprintf(stderr, "\n");
}